

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listmenu.cpp
# Opt level: O0

bool __thiscall DListMenu::Responder(DListMenu *this,event_t *ev)

{
  int iVar1;
  uint uVar2;
  FListMenuItem **ppFVar3;
  float fVar4;
  FSoundID local_34;
  int local_30;
  FSoundID local_2c;
  int i_1;
  uint local_24;
  uint i;
  int ch;
  event_t *ev_local;
  DListMenu *this_local;
  
  _i = ev;
  ev_local = (event_t *)this;
  if ((ev->type == '\x04') && (ev->subtype == '\x01')) {
    local_24 = tolower((int)ev->data1);
    i_1 = this->mDesc->mSelectedItem;
    do {
      i_1 = i_1 + 1;
      iVar1 = i_1;
      uVar2 = TArray<FListMenuItem_*,_FListMenuItem_*>::Size
                        (&(this->mDesc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>);
      if (uVar2 <= (uint)iVar1) {
        for (local_30 = 0; local_30 < this->mDesc->mSelectedItem; local_30 = local_30 + 1) {
          ppFVar3 = TArray<FListMenuItem_*,_FListMenuItem_*>::operator[]
                              (&(this->mDesc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>
                               ,(long)local_30);
          uVar2 = (*(*ppFVar3)->_vptr_FListMenuItem[0xf])(*ppFVar3,(ulong)local_24);
          if ((uVar2 & 1) != 0) {
            this->mDesc->mSelectedItem = local_30;
            FSoundID::FSoundID(&local_34,"menu/cursor");
            fVar4 = FFloatCVar::operator_cast_to_float(&snd_menuvolume);
            S_Sound(0x22,&local_34,fVar4,0.0);
            return true;
          }
        }
        goto LAB_003bea4b;
      }
      ppFVar3 = TArray<FListMenuItem_*,_FListMenuItem_*>::operator[]
                          (&(this->mDesc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>,
                           (ulong)(uint)i_1);
      uVar2 = (*(*ppFVar3)->_vptr_FListMenuItem[0xf])(*ppFVar3,(ulong)local_24);
    } while ((uVar2 & 1) == 0);
    this->mDesc->mSelectedItem = i_1;
    FSoundID::FSoundID(&local_2c,"menu/cursor");
    fVar4 = FFloatCVar::operator_cast_to_float(&snd_menuvolume);
    S_Sound(0x22,&local_2c,fVar4,0.0);
    this_local._7_1_ = true;
  }
  else {
LAB_003bea4b:
    this_local._7_1_ = DMenu::Responder(&this->super_DMenu,_i);
  }
  return this_local._7_1_;
}

Assistant:

bool DListMenu::Responder (event_t *ev)
{
	if (ev->type == EV_GUI_Event)
	{
		if (ev->subtype == EV_GUI_KeyDown)
		{
			int ch = tolower (ev->data1);

			for(unsigned i = mDesc->mSelectedItem + 1; i < mDesc->mItems.Size(); i++)
			{
				if (mDesc->mItems[i]->CheckHotkey(ch))
				{
					mDesc->mSelectedItem = i;
					S_Sound(CHAN_VOICE | CHAN_UI, "menu/cursor", snd_menuvolume, ATTN_NONE);
					return true;
				}
			}
			for(int i = 0; i < mDesc->mSelectedItem; i++)
			{
				if (mDesc->mItems[i]->CheckHotkey(ch))
				{
					mDesc->mSelectedItem = i;
					S_Sound(CHAN_VOICE | CHAN_UI, "menu/cursor", snd_menuvolume, ATTN_NONE);
					return true;
				}
			}
		}
	}
	return Super::Responder(ev);
}